

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param-utils.cpp
# Opt level: O0

SortedVector *
wasm::ParamUtils::removeParameters
          (SortedVector *__return_storage_ptr__,
          vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *funcs,SortedVector *indexes,
          vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *calls,
          vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_> *callRefs,Module *module,
          PassRunner *runner)

{
  Function *this;
  bool bVar1;
  size_type sVar2;
  const_reference ppFVar3;
  reference ppFVar4;
  size_t sVar5;
  Index local_64;
  Index i;
  Function *func;
  const_iterator __end2;
  const_iterator __begin2;
  vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *__range2;
  Function *first;
  Module *module_local;
  vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_> *callRefs_local;
  vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *calls_local;
  SortedVector *indexes_local;
  vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *funcs_local;
  SortedVector *removed;
  
  bVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                    (&indexes->super_vector<unsigned_int,_std::allocator<unsigned_int>_>);
  if (bVar1) {
    memset(__return_storage_ptr__,0,0x18);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&__return_storage_ptr__->super_vector<unsigned_int,_std::allocator<unsigned_int>_>);
  }
  else {
    sVar2 = std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::size(funcs);
    if (sVar2 == 0) {
      __assert_fail("funcs.size() > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/param-utils.cpp"
                    ,0xb1,
                    "SortedVector wasm::ParamUtils::removeParameters(const std::vector<Function *> &, SortedVector, const std::vector<Call *> &, const std::vector<CallRef *> &, Module *, PassRunner *)"
                   );
    }
    ppFVar3 = std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::operator[](funcs,0);
    this = *ppFVar3;
    __end2 = std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::begin(funcs);
    func = (Function *)std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::end(funcs);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<wasm::Function_*const_*,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
                                       *)&func), bVar1) {
      ppFVar4 = __gnu_cxx::
                __normal_iterator<wasm::Function_*const_*,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
                ::operator*(&__end2);
      bVar1 = HeapType::operator==(&(*ppFVar4)->type,&this->type);
      if (!bVar1) {
        __assert_fail("func->type == first->type",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/param-utils.cpp"
                      ,0xb5,
                      "SortedVector wasm::ParamUtils::removeParameters(const std::vector<Function *> &, SortedVector, const std::vector<Call *> &, const std::vector<CallRef *> &, Module *, PassRunner *)"
                     );
      }
      __gnu_cxx::
      __normal_iterator<wasm::Function_*const_*,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
      ::operator++(&__end2);
    }
    sVar5 = Function::getNumParams(this);
    local_64 = (Index)sVar5;
    SortedVector::SortedVector(__return_storage_ptr__);
    do {
      local_64 = local_64 - 1;
      bVar1 = SortedVector::has(indexes,local_64);
      if ((bVar1) && (bVar1 = removeParameter(funcs,local_64,calls,callRefs,module,runner), bVar1))
      {
        SortedVector::insert(__return_storage_ptr__,local_64);
      }
    } while (local_64 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

SortedVector removeParameters(const std::vector<Function*>& funcs,
                              SortedVector indexes,
                              const std::vector<Call*>& calls,
                              const std::vector<CallRef*>& callRefs,
                              Module* module,
                              PassRunner* runner) {
  if (indexes.empty()) {
    return {};
  }

  assert(funcs.size() > 0);
  auto* first = funcs[0];
#ifndef NDEBUG
  for (auto* func : funcs) {
    assert(func->type == first->type);
  }
#endif

  // Iterate downwards, as we may remove more than one, and going forwards would
  // alter the indexes after us.
  Index i = first->getNumParams() - 1;
  SortedVector removed;
  while (1) {
    if (indexes.has(i)) {
      if (removeParameter(funcs, i, calls, callRefs, module, runner)) {
        // Success!
        removed.insert(i);
      }
    }
    if (i == 0) {
      break;
    }
    i--;
  }
  return removed;
}